

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O2

void __thiscall I2cAnalyzer::GetByte(I2cAnalyzer *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  FrameV2 framev2;
  ulonglong local_88;
  U64 potential_ending_sample;
  DataBuilder byte;
  U64 value;
  BitState ack_bit_state;
  U64 scl_rising_edge;
  Frame frame;
  
  puVar1 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mArrowLocations).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->mArrowLocations).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  DataBuilder::DataBuilder(&byte);
  DataBuilder::Reset((ulonglong *)&byte,(ShiftOrder)&value,0);
  potential_ending_sample = 0;
  local_88 = 0;
  iVar6 = 8;
  while (iVar5 = iVar6 + -1, iVar6 != 0) {
    bVar3 = GetBitPartOne(this,(BitState *)&scl_rising_edge,(U64 *)&frame,&potential_ending_sample);
    bVar4 = GetBitPartTwo(this);
    if (!bVar3 || !bVar4) goto LAB_00105f1f;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              (&this->mArrowLocations,(value_type *)&frame);
    DataBuilder::AddBit((BitState)&byte);
    bVar3 = iVar6 == 8;
    iVar6 = iVar5;
    if (bVar3) {
      local_88 = _frame;
    }
  }
  AnalyzerChannelData::GetSampleNumber();
  bVar3 = GetBitPartOne(this,&ack_bit_state,&scl_rising_edge,&potential_ending_sample);
  FrameV2::FrameV2(&framev2);
  Frame::Frame(&frame);
  _frame = local_88;
  if (bVar3) {
    FrameV2::AddBoolean((char *)&framev2,true);
    if ((bVar3 & this->mNeedAddress) == 1) {
      this->mNeedAddress = false;
      pcVar7 = "address";
      FrameV2::AddByte((char *)&framev2,'\x1a');
      FrameV2::AddBoolean((char *)&framev2,true);
      goto LAB_00105e9d;
    }
  }
  else {
    FrameV2::AddString((char *)&framev2,"error");
  }
  pcVar7 = "data";
  FrameV2::AddByte((char *)&framev2,'\'');
LAB_00105e9d:
  AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
  AnalyzerResults::AddFrameV2
            ((FrameV2 *)(this->mResults)._M_ptr,(char *)&framev2,(ulonglong)pcVar7,local_88);
  puVar1 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this->mArrowLocations).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar8 = 0; ((ulong)((long)puVar1 - (long)puVar2) >> 3 & 0xffffffff) != uVar8;
      uVar8 = uVar8 + 1) {
    AnalyzerResults::AddMarker
              ((ulonglong)(this->mResults)._M_ptr,
               (MarkerType)
               (this->mArrowLocations).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8],(Channel *)0x4);
  }
  AnalyzerResults::CommitResults();
  GetBitPartTwo(this);
  Frame::~Frame(&frame);
  FrameV2::~FrameV2(&framev2);
LAB_00105f1f:
  DataBuilder::~DataBuilder(&byte);
  return;
}

Assistant:

void I2cAnalyzer::GetByte()
{
    mArrowLocations.clear();
    U64 value;
    DataBuilder byte;
    byte.Reset( &value, AnalyzerEnums::MsbFirst, 8 );
    U64 starting_sample = 0;
    U64 potential_ending_sample = 0;

    for( U32 i = 0; i < 8; i++ )
    {
        BitState bit_state;
        U64 scl_rising_edge;
        bool result = GetBitPartOne( bit_state, scl_rising_edge, potential_ending_sample );
        result &= GetBitPartTwo();
        if( result == true )
        {
            mArrowLocations.push_back( scl_rising_edge );
            byte.AddBit( bit_state );

            if( i == 0 )
                starting_sample = scl_rising_edge;
        }
        else
        {
            return;
        }
    }

    BitState ack_bit_state;
    U64 scl_rising_edge;
    S64 last_valid_sample = mScl->GetSampleNumber();
    bool result = GetBitPartOne( ack_bit_state, scl_rising_edge, potential_ending_sample ); // GetBit( ack_bit_state, scl_rising_edge );

    FrameV2 framev2;
    char* framev2Type = nullptr;

    Frame frame;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = result ? potential_ending_sample : last_valid_sample;
    frame.mData1 = U8( value );

    if( !result )
    {
        framev2.AddString( "error", "missing ack/nak" );
        frame.mFlags = I2C_MISSING_FLAG_ACK;
    }
    else
    {
        bool ack = ack_bit_state == BIT_LOW;

        // true == ack, false == nak
        framev2.AddBoolean( "ack", ack );
        if( ack )
        {
            frame.mFlags = I2C_FLAG_ACK;
        }
    }

    if( mNeedAddress == true && result == true ) // if result is false, then we have already recorded a stop bit and toggled mNeedAddress
    {
        mNeedAddress = false;
        bool is_read = value & 0x01;
        U8 address = value >> 1;
        frame.mType = I2cAddress;
        framev2Type = "address";
        framev2.AddByte( "address", address );
        framev2.AddBoolean( "read", is_read );
    }
    else
    {
        frame.mType = I2cData;
        framev2Type = "data";
        framev2.AddByte( "data", value );
    }

    mResults->AddFrame( frame );
    mResults->AddFrameV2( framev2, framev2Type, starting_sample, result ? potential_ending_sample : last_valid_sample );

    U32 count = mArrowLocations.size();
    for( U32 i = 0; i < count; i++ )
    {
        mResults->AddMarker( mArrowLocations[ i ], AnalyzerResults::UpArrow, mSettings->mSclChannel );
    }

    mResults->CommitResults();

    result &= GetBitPartTwo();
}